

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileTests.cpp
# Opt level: O0

void __thiscall
solitaire::piles::TableauPileWithUncoveredTopCardTest_tryAddCardsWhenFirstCardColorIsIncorrect_Test
::~TableauPileWithUncoveredTopCardTest_tryAddCardsWhenFirstCardColorIsIncorrect_Test
          (TableauPileWithUncoveredTopCardTest_tryAddCardsWhenFirstCardColorIsIncorrect_Test *this)

{
  TableauPileWithUncoveredTopCardTest_tryAddCardsWhenFirstCardColorIsIncorrect_Test *this_local;
  
  ~TableauPileWithUncoveredTopCardTest_tryAddCardsWhenFirstCardColorIsIncorrect_Test(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

TEST_F(TableauPileWithUncoveredTopCardTest,
       tryAddCardsWhenFirstCardColorIsIncorrect)
{
    cardsToAdd.front() = Card {cardsToAdd.front().getValue(), Suit::Diamond};
    const auto cardsLeftAfterAdding = cardsToAdd;

    pile->tryAddCards(cardsToAdd);

    EXPECT_THAT(cardsToAdd, ContainerEq(cardsLeftAfterAdding));
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
}